

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O0

bool iDynTree::vector3FromString(string *vector_str,Vector3 *out)

{
  undefined1 uVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  reference pvVar6;
  double *pdVar7;
  VectorFixSize<3U> *in_RSI;
  double *in_stack_00000008;
  string *in_stack_00000010;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000018;
  string *in_stack_00000020;
  string errStr_1;
  string errStr;
  double newDouble;
  uint i;
  vector<double,_std::allocator<double>_> xyz;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  char *in_stack_fffffffffffffe58;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  value_type vVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffea0;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [36];
  undefined4 local_a4;
  string local_a0 [32];
  string local_80 [40];
  uint local_58;
  vector<double,_std::allocator<double>_> local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  VectorFixSize<3U> *local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar9;
  
  local_18 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1a21b9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1a21c6);
  splitString(in_stack_00000020,in_stack_00000018);
  local_58 = 0;
  do {
    pcVar4 = (char *)(ulong)local_58;
    pcVar3 = (char *)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&local_30);
    if (pcVar3 <= pcVar4) {
      sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_48);
      if (sVar5 == 3) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,0);
        vVar8 = *pvVar6;
        pdVar7 = VectorFixSize<3U>::operator()(local_18,0);
        *pdVar7 = vVar8;
        in_stack_fffffffffffffe70 = (vector<double,_std::allocator<double>_> *)0x1;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,1);
        vVar8 = *pvVar6;
        pdVar7 = VectorFixSize<3U>::operator()(local_18,(size_t)in_stack_fffffffffffffe70);
        *pdVar7 = vVar8;
        index = 2;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,2);
        vVar8 = *pvVar6;
        pdVar7 = VectorFixSize<3U>::operator()(local_18,index);
        *pdVar7 = vVar8;
        bVar9 = 1;
        local_a4 = 1;
      }
      else {
        std::vector<double,_std::allocator<double>_>::size(&local_48);
        intToString_abi_cxx11_(CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        std::operator+((char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
        std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
        std::__cxx11::string::~string(local_e8);
        std::__cxx11::string::~string(local_108);
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::~string(local_148);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("","vector3FromString",pcVar4);
        bVar9 = 0;
        local_a4 = 1;
        std::__cxx11::string::~string(local_c8);
      }
LAB_001a267d:
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe70);
      return (bool)(bVar9 & 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_30,(ulong)local_58);
    uVar1 = std::operator!=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if ((bool)uVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_30,(ulong)local_58);
      uVar2 = stringToDoubleWithClassicLocale(in_stack_00000010,in_stack_00000008);
      if (!(bool)uVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_30,(ulong)local_58);
        std::operator+(pcVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffea0)));
        std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
        std::__cxx11::string::~string(local_a0);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("","vector3FromString",pcVar4);
        bVar9 = 0;
        local_a4 = 1;
        std::__cxx11::string::~string(local_80);
        goto LAB_001a267d;
      }
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffe70,(value_type_conflict2 *)in_stack_fffffffffffffe68);
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

bool inline vector3FromString(const std::string & vector_str, Vector3 & out)
{
    std::vector<std::string> pieces;
    std::vector<double> xyz;
    splitString(vector_str,pieces);
    for (unsigned int i = 0; i < pieces.size(); ++i)
    {
      if (pieces[i] != ""){
       double newDouble;
       if( stringToDoubleWithClassicLocale(pieces[i],newDouble) )
       {
          xyz.push_back(newDouble);
       }
       else
       {
           std::string errStr = "Unable to parse component [" + pieces[i] + "] to a double (while parsing a vector value)";
           reportError("","vector3FromString",errStr.c_str());
           return false;
       }
      }
    }

    if (xyz.size() != 3)
    {
        std::string errStr = "Parser found " + intToString(xyz.size())  + " elements but 3 expected while parsing vector [" + vector_str + "]";
        reportError("","vector3FromString",errStr.c_str());
        return false;
    }

    out(0) = xyz[0];
    out(1) = xyz[1];
    out(2) = xyz[2];

    return true;
}